

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O2

void __thiscall
anurbs::PointOnCurveProjection<2L>::compute
          (PointOnCurveProjection<2L> *this,Vector *sample,double max_distance)

{
  Pointer<CurveBaseD> *pPVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pMVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Index i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double extraout_XMM1_Qa;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  Vector point_at_t1;
  undefined4 local_168;
  Vector closest_point;
  value_type t1;
  value_type t0;
  value_type point0;
  Vector point_at_t0;
  pointer local_e8;
  scalar_constant_op<double> sStack_e0;
  value_type point1;
  _Head_base<1UL,_long,_false> local_88;
  _Head_base<0UL,_double,_false> local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  Vector v;
  Vector local_48;
  
  pPVar1 = &this->m_curve;
  std::__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t0,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>);
  dVar11 = (double)(**(code **)(*(long *)point_at_t0.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                                         .m_storage.m_data.array[0] + 0x18))();
  local_168 = SUB84(extraout_XMM1_Qa,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array + 1));
  local_1b8 = 0.0;
  if (max_distance <= 0.0) {
    local_1c8 = INFINITY;
    lVar8 = 0x10;
    for (lVar7 = 1;
        pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar7 < (long)(this->m_tessellation).first.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar3 >> 3; lVar7 = lVar7 + 1) {
      t0 = pdVar3[lVar7 + 0xffffffffffffffff];
      pMVar4 = (this->m_tessellation).second.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (double *)
               ((long)&pMVar4[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar8);
      point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
           = *pdVar2;
      point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
           = pdVar2[1];
      t1 = pdVar3[lVar7];
      pdVar2 = (double *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                       m_storage.m_data + lVar8);
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
           = *pdVar2;
      point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
           = pdVar2[1];
      project_to_line((ParameterPoint *)&point_at_t0,sample,&point0,&point1,&t0,&t1);
      point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
      array[0] = (double)&local_e8;
      point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
      array[1] = (double)sample;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&v,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                  *)&point_at_t1);
      dVar16 = v.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
               [1] * v.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                     .array[1] +
               v.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
               [0] * v.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                     .array[0];
      if (dVar16 < local_1c8) {
        local_1b8 = point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                    m_storage.m_data.array[0];
        closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
        array[0] = (double)local_e8;
        closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
        array[1] = sStack_e0.m_other;
        local_1c8 = dVar16;
      }
      lVar8 = lVar8 + 0x10;
    }
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1];
    PolylineMapper<2L>::map
              ((tuple<double,_long,_double,_long> *)&point1,
               (this->mapper)._M_t.
               super___uniq_ptr_impl<anurbs::PolylineMapper<2L>,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_anurbs::PolylineMapper<2L>_*,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               .super__Head_base<0UL,_anurbs::PolylineMapper<2L>_*,_false>._M_head_impl,&local_48,
               max_distance);
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1b8 = local_80._M_head_impl * pdVar3[local_88._M_head_impl] +
                point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                .array[1] *
                pdVar3[(long)point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                             m_storage.m_data.array[0]];
    Eigen::operator*((type *)&point_at_t1,&local_80._M_head_impl,
                     (StorageBaseType *)
                     ((this->m_tessellation).second.
                      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_88._M_head_impl));
    Eigen::operator*((type *)&point0,
                     point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                     m_data.array + 1,
                     (StorageBaseType *)
                     ((this->m_tessellation).second.
                      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     (long)point1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                           m_storage.m_data.array[0]));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,2,1,1,2>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const,Eigen::Matrix<double,1,2,1,1,2>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const,Eigen::Matrix<double,1,2,1,1,2>const>const>>
              (&closest_point,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&point_at_t0);
  }
  dVar16 = this->m_tolerance;
  local_68 = dVar16 * 5.0;
  dStack_60 = 0.0;
  local_78 = extraout_XMM1_Qa;
  if (dVar11 <= extraout_XMM1_Qa) {
    local_78 = dVar11;
  }
  dVar17 = extraout_XMM1_Qa;
  if (extraout_XMM1_Qa <= dVar11) {
    dVar17 = dVar11;
  }
  lVar7 = 6;
  uStack_70 = extraout_XMM1_Qb;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) break;
    std::__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
               &pPVar1->super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[0] + 0x30))
              (local_1b8._0_4_,
               (_Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&point_at_t0,
               point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[0],2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                m_data.array + 1));
    point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
    [0] = point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
          array[0];
    point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
    [1] = (double)sample;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&point0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&point_at_t1);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
         [1] * point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
               array[1] +
         point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
         [0] * point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
               array[0];
    auVar18 = sqrtpd(in_XMM3,auVar18);
    dVar19 = *(double *)
              ((long)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                     m_storage.m_data.array[0] + 0x10);
    dVar6 = *(double *)
             ((long)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                    m_storage.m_data.array[0] + 0x18);
    dVar15 = point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
             array[1] * dVar6 +
             point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
             array[0] * dVar19;
    dVar19 = dVar6 * dVar6 + dVar19 * dVar19;
    dVar21 = SQRT(dVar19) * auVar18._0_8_;
    auVar20._0_8_ =
         -(ulong)(local_68 <= (double)(-(ulong)(dVar21 != 0.0) & (ulong)ABS(dVar15 / dVar21)) &&
                 dVar16 <= auVar18._0_8_);
    auVar20._8_8_ =
         -(ulong)(dStack_60 <=
                  (double)((ulong)(dVar6 * dVar6) &
                          (ulong)ABS(point0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                     m_storage.m_data.array[1] * dVar6)) && 0.0 <= auVar18._8_8_);
    in_XMM3 = auVar20;
    if ((auVar20._0_8_ & 1) != 0) {
      local_1b8 = local_1b8 -
                  dVar15 / (dVar19 + point0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                     m_storage.m_data.array[1] *
                                     *(double *)
                                      ((long)point_at_t0.
                                             super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                                             .m_storage.m_data.array[0] + 0x28) +
                                     point0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                     m_storage.m_data.array[0] *
                                     *(double *)
                                      ((long)point_at_t0.
                                             super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                                             .m_storage.m_data.array[0] + 0x20));
      dVar19 = dVar17;
      if (local_1b8 <= dVar17) {
        dVar19 = local_1b8;
      }
      in_XMM3._8_8_ = uStack_70;
      in_XMM3._0_8_ = local_78;
      local_1b8 = (double)(-(ulong)(local_1b8 < local_78) & (ulong)local_78 |
                          ~-(ulong)(local_1b8 < local_78) & (ulong)dVar19);
    }
    std::
    _Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     *)&point_at_t0);
  } while ((auVar20._0_8_ & 1) != 0);
  std::__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                        m_storage.m_data.array[0] + 0x28))(local_1b8._0_4_,&point_at_t0);
  Eigen::Matrix<double,_1,_2,_1,_1,_2>::operator=(&closest_point,&point_at_t0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array + 1));
  dVar16 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0] -
           closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
           m_data.array[0];
  dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1] -
           closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
           m_data.array[1];
  auVar5._8_4_ = SUB84(dVar17,0);
  auVar5._0_8_ = dVar16;
  auVar5._12_4_ = (int)((ulong)dVar17 >> 0x20);
  std::__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2> *)&point_at_t1,
             &pPVar1->super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                        m_storage.m_data.array[0] + 0x28))(SUB84(dVar11,0),&point_at_t0);
  dStack_1c0 = auVar5._8_8_;
  dVar16 = dStack_1c0 * dStack_1c0 + dVar16 * dVar16;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array + 1));
  uVar10 = SUB84(point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                 m_data.array[0],0);
  uVar12 = (undefined4)
           ((ulong)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[0] >> 0x20);
  uVar13 = SUB84(point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                 m_data.array[1],0);
  uVar14 = (undefined4)
           ((ulong)point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[1] >> 0x20);
  dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0] -
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
           .array[0];
  dVar19 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1] -
           point_at_t0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
           .array[1];
  if (dVar16 <= dVar19 * dVar19 + dVar17 * dVar17) {
    std::__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2> *)&point0,
               &pPVar1->super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*(long *)point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[0] + 0x28))(local_168,&point_at_t1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (point0.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                .array + 1));
    dVar11 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[0] -
             point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
             m_data.array[0];
    dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[1] -
             point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
             m_data.array[1];
    dVar11 = dVar17 * dVar17 + dVar11 * dVar11;
    uVar9 = -(ulong)(dVar11 < dVar16);
    uVar10 = SUB84(point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[0],0);
    uVar12 = (int)((ulong)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[0] >> 0x20);
    uVar13 = SUB84(point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                   m_storage.m_data.array[1],0);
    uVar14 = (int)((ulong)point_at_t1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[1] >> 0x20);
    if (dVar16 <= dVar11) {
      uVar10 = closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[0]._0_4_;
      uVar12 = closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[0]._4_4_;
      uVar13 = closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[1]._0_4_;
      uVar14 = closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[1]._4_4_;
    }
    this->m_parameter = (double)(~uVar9 & (ulong)local_1b8 | uVar9 & (ulong)extraout_XMM1_Qa);
  }
  else {
    this->m_parameter = dVar11;
  }
  *(undefined4 *)
   (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
   array = uVar10;
  *(undefined4 *)
   ((long)(this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
          m_data.array + 4) = uVar12;
  *(undefined4 *)
   ((this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
    array + 1) = uVar13;
  *(undefined4 *)
   ((long)(this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
          m_data.array + 0xc) = uVar14;
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }